

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O0

Literal * __thiscall
Shell::AnswerLiteralManager::getAnswerLiteral
          (AnswerLiteralManager *this,VList *vars,SList *srts,Formula *f)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  Symbol *this_00;
  Stack<Kernel::TermList> *this_01;
  List<Kernel::TermList> *in_RDX;
  List<unsigned_int> *in_RSI;
  Formula *in_RDI;
  uint unaff_retaddr;
  char *in_stack_00000008;
  char *in_stack_00000010;
  uint in_stack_0000001c;
  Signature *in_stack_00000020;
  Symbol *predSym;
  uint pred;
  uint vcnt;
  TermList sort;
  uint var;
  TermStack sorts;
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  TermList in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  Stack<Kernel::TermList> *in_stack_fffffffffffffef0;
  uint arity;
  Symbol *args;
  undefined1 polarity;
  TermList local_60;
  uint local_54;
  Stack<Kernel::TermList> local_50;
  List<Kernel::TermList> *local_18;
  
  local_18 = in_RDX;
  if ((getAnswerLiteral(Lib::List<unsigned_int>*,Lib::List<Kernel::TermList>*,Kernel::Formula*)::
       litArgs == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getAnswerLiteral(Lib::List<unsigned_int>*,Lib::List<Kernel::TermList>*,Kernel::Formula*)
                                   ::litArgs), iVar2 != 0)) {
    Lib::Stack<Kernel::TermList>::Stack
              (in_stack_fffffffffffffef0,
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&getAnswerLiteral::litArgs,&__dso_handle);
    __cxa_guard_release(&getAnswerLiteral(Lib::List<unsigned_int>*,Lib::List<Kernel::TermList>*,Kernel::Formula*)
                         ::litArgs);
  }
  Lib::Stack<Kernel::TermList>::reset(&getAnswerLiteral::litArgs);
  Lib::Stack<Kernel::TermList>::Stack
            (in_stack_fffffffffffffef0,CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
            );
  while( true ) {
    bVar1 = Lib::List<unsigned_int>::isNonEmpty(in_RSI);
    arity = (uint)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    if (!bVar1) break;
    local_54 = Lib::List<unsigned_int>::head(in_RSI);
    in_RSI = Lib::List<unsigned_int>::tail(in_RSI);
    Kernel::TermList::TermList(&local_60);
    bVar1 = Lib::List<Kernel::TermList>::isNonEmpty(local_18);
    if (bVar1) {
      local_60 = Lib::List<Kernel::TermList>::head(local_18);
      local_18 = Lib::List<Kernel::TermList>::tail(local_18);
    }
    else {
      bVar1 = Kernel::SortHelper::tryGetVariableSort(unaff_retaddr,in_RDI,(TermList *)in_RSI);
      if (!bVar1) {
        local_60 = Kernel::AtomicSort::defaultSort();
      }
    }
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffee0._content,in_stack_fffffffffffffedc,
               SUB41((uint)in_stack_fffffffffffffed8 >> 0x18,0));
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               in_stack_fffffffffffffee0);
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               in_stack_fffffffffffffee0);
  }
  sVar4 = Lib::Stack<Kernel::TermList>::size(&getAnswerLiteral::litArgs);
  uVar3 = Kernel::Signature::addFreshPredicate
                    (in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_00000008);
  polarity = (undefined1)(uVar3 >> 0x18);
  this_00 = Kernel::Signature::getPredicate
                      ((Signature *)in_stack_fffffffffffffee0._content,in_stack_fffffffffffffedc);
  args = this_00;
  Lib::Stack<Kernel::TermList>::size(&local_50);
  Lib::Stack<Kernel::TermList>::begin(&local_50);
  Kernel::OperatorType::getPredicateType
            (arity,(TermList *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (uint)(in_stack_fffffffffffffee0._content >> 0x20));
  Kernel::Signature::Symbol::setType
            ((Symbol *)in_stack_fffffffffffffee0._content,
             (OperatorType *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  Kernel::Signature::Symbol::markAnswerPredicate((Symbol *)0xb7b14f);
  Kernel::Signature::Symbol::markSkipCongruence(this_00);
  Lib::Stack<Kernel::TermList>::begin(&getAnswerLiteral::litArgs);
  this_01 = (Stack<Kernel::TermList> *)
            Kernel::Literal::create
                      ((uint)(sVar4 >> 0x20),(uint)sVar4,(bool)polarity,(TermList *)args);
  Lib::Stack<Kernel::TermList>::~Stack(this_01);
  return (Literal *)this_01;
}

Assistant:

Literal* AnswerLiteralManager::getAnswerLiteral(VList* vars,SList* srts,Formula* f)
{
  static Stack<TermList> litArgs;
  litArgs.reset();
  TermStack sorts;
  while(VList::isNonEmpty(vars)) {
    unsigned var = vars->head();
    vars = vars->tail();
    TermList sort;
    if (SList::isNonEmpty(srts)) {
      sort = srts->head();
      srts = srts->tail();
    } else if(!SortHelper::tryGetVariableSort(var, f, sort)) {
      sort = AtomicSort::defaultSort();
    }
    litArgs.push(TermList(var, false));
    sorts.push(sort);
  }

  unsigned vcnt = litArgs.size();
  unsigned pred = env.signature->addFreshPredicate(vcnt,"ans");
  Signature::Symbol* predSym = env.signature->getPredicate(pred);
  predSym->setType(OperatorType::getPredicateType(sorts.size(), sorts.begin()));
  predSym->markAnswerPredicate();
  // don't need equality proxy for answer literals
  predSym->markSkipCongruence();
  return Literal::create(pred, vcnt, true, litArgs.begin());
}